

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_insert_common(lyd_node *parent,lyd_node **sibling,lyd_node *node,int invalidate)

{
  lyd_node **pplVar1;
  lyd_node *plVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  lys_node *plVar6;
  lys_node *plVar7;
  ly_set *set;
  lys_node_list *plVar8;
  lyd_node *plVar9;
  lys_module *module;
  lys_node *plVar10;
  lyd_node **pplVar11;
  lyd_node *plVar12;
  uint uVar13;
  lyd_node *plVar14;
  lys_node_leaf *node_00;
  char *pcVar15;
  char *pcVar16;
  lyd_node *plVar17;
  LYS_NODE LVar18;
  bool bVar19;
  int local_54;
  byte local_41;
  lyd_node *plStack_40;
  uint8_t pos;
  char local_31;
  
  if (parent == (lyd_node *)0x0 && sibling == (lyd_node **)0x0) {
    __assert_fail("parent || sibling",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x10df,
                  "int lyd_insert_common(struct lyd_node *, struct lyd_node **, struct lyd_node *, int)"
                 );
  }
  if (parent == (lyd_node *)0x0) {
    plVar14 = *sibling;
    do {
      plStack_40 = plVar14;
      plVar14 = plStack_40->prev;
    } while (plStack_40->prev->next != (lyd_node *)0x0);
  }
  else {
    plStack_40 = parent->child;
    plVar6 = parent->schema;
    if (plStack_40 == (lyd_node *)0x0) {
      LVar18 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      if ((plVar6->nodetype & (LYS_ACTION|LYS_RPC)) == LYS_UNKNOWN) {
        LVar18 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
      }
      goto LAB_00164955;
    }
    LVar18 = LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
    if ((plVar6->nodetype & (LYS_ACTION|LYS_RPC)) != LYS_UNKNOWN) goto LAB_00164955;
  }
  plVar6 = lys_parent(plStack_40->schema);
  LVar18 = LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER;
  for (; plVar6 != (lys_node *)0x0; plVar6 = lys_parent(plVar6)) {
    if ((plVar6->nodetype & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) != LYS_UNKNOWN)
    goto LAB_00164955;
  }
  plVar6 = (lys_node *)0x0;
LAB_00164955:
  plVar7 = node->schema;
  do {
    plVar7 = lys_parent(plVar7);
    if (plVar7 == (lys_node *)0x0) break;
  } while ((plVar7->nodetype & LVar18) == LYS_UNKNOWN);
  if (plVar6 != plVar7) {
    pcVar16 = "<top-lvl>";
    pcVar15 = "<top-lvl>";
    if (plVar6 != (lys_node *)0x0) {
      pcVar15 = plVar6->name;
    }
    if (plVar7 != (lys_node *)0x0) {
      pcVar16 = plVar7->name;
    }
    ly_log(parent->schema->module->ctx,LY_LLERR,LY_EINVAL,
           "Cannot insert, different parents (\"%s\" and \"%s\").",pcVar15,pcVar16);
    return 1;
  }
  local_31 = '\x01';
  local_54 = 0;
  if ((invalidate != 0) &&
     ((iVar4 = lyp_is_rpc_action(node->schema), parent == (lyd_node *)0x0 ||
      (iVar4 != 0 || node->parent != parent)))) {
    local_54 = iVar4 + 1;
    local_31 = iVar4 == 0;
  }
  if ((node->parent != (lyd_node *)0x0) || (node->prev->next != (lyd_node *)0x0)) {
    lyd_unlink_internal(node,local_54);
  }
  set = ly_set_new();
  pplVar1 = &parent->child;
  bVar3 = false;
LAB_00164a3f:
  plVar14 = node;
  if (plVar14 == (lyd_node *)0x0) {
    ly_set_free(set);
    if (bVar3) {
      for (; (parent != (lyd_node *)0x0 && ((parent->field_0x9 & 1) != 0)); parent = parent->parent)
      {
        parent->field_0x9 = parent->field_0x9 & 0xfe;
      }
    }
    if (sibling == (lyd_node **)0x0) {
      return 0;
    }
    *sibling = plStack_40;
    return 0;
  }
  node = plVar14->next;
  if ((local_54 == 1) &&
     (iVar4 = lyv_multicases(plVar14,(lys_node *)0x0,&stack0xffffffffffffffc0,1,(lyd_node *)0x0),
     iVar4 != 0)) {
    ly_set_free(set);
    return 1;
  }
  plVar14->prev = plVar14;
  plVar14->next = (lyd_node *)0x0;
  bVar19 = (plVar14->field_0x9 & 1) != 0;
  if (!bVar19) {
    bVar3 = true;
  }
  node_00 = (lys_node_leaf *)plVar14->schema;
  if ((bVar19) || (node_00->nodetype != LYS_LEAF)) {
LAB_00164ae3:
    LVar18 = node_00->nodetype;
    if (LVar18 == LYS_CONTAINER) {
      if ((node_00->type).ext == (lys_ext_instance **)0x0) goto LAB_00164b8f;
    }
    else {
      if (LVar18 == LYS_LEAF) {
LAB_00164b8f:
        pplVar11 = &stack0xffffffffffffffc0;
LAB_00164b93:
        plVar17 = *pplVar11;
        if (plVar17 != (lyd_node *)0x0) {
          if ((lys_node_leaf *)plVar17->schema != node_00) goto code_r0x00164ba4;
          if (((plVar14->field_0x9 & 1) != 0) || ((plVar17->field_0x9 & 1) != 0)) {
            plVar9 = plVar14;
            if ((plVar14->parent == (lyd_node *)0x0) && (plVar14->prev->next == (lyd_node *)0x0)) {
              while (plVar9->next != (lyd_node *)0x0) {
                plVar9->parent = plVar17->parent;
                plVar9 = plVar9->next;
              }
            }
            else {
              plVar14->next = (lyd_node *)0x0;
              plVar14->prev = plVar14;
            }
            plVar2 = plVar17->parent;
            if (plVar2 != (lyd_node *)0x0) {
              if (plVar2->child == plVar17) {
                plVar2->child = plVar14;
              }
              plVar17->parent = (lyd_node *)0x0;
            }
            plVar2 = plVar17->prev;
            if (plVar2 != plVar17) {
              if (plVar2->next != (lyd_node *)0x0) {
                plVar2->next = plVar14;
              }
              plVar14->prev = plVar2;
              plVar17->prev = plVar17;
              plVar2 = plVar17->next;
              if (plVar2 == (lyd_node *)0x0) {
                plVar2 = plVar14;
                if (plVar14->parent == (lyd_node *)0x0) {
                  do {
                    plVar12 = plVar2;
                    plVar2 = plVar12->prev;
                  } while (plVar2 != plVar17);
                  plVar12->prev = plVar9;
                }
                else {
                  plVar14->parent->child->prev = plVar9;
                }
              }
              else {
                plVar2->prev = plVar9;
                plVar9->next = plVar2;
                plVar17->next = (lyd_node *)0x0;
              }
            }
            lyd_free(plVar17);
            goto LAB_00164e0c;
          }
        }
        goto LAB_00164ca8;
      }
      if ((LVar18 == LYS_LEAFLIST) &&
         ((uVar13 = set->number, uVar5 = ly_set_add(set,node_00,0), plVar17 = plStack_40,
          uVar5 != uVar13 || ((plVar14->field_0x9 & 1) != 0)))) {
LAB_00164b23:
        plVar9 = plVar17;
        if (plVar9 != (lyd_node *)0x0) {
          plVar17 = plVar9->next;
          if (plVar9->schema == plVar14->schema) {
            if ((plVar14->field_0x9 & 1) == 0) {
              if ((plVar9->field_0x9 & 1) == 0) goto LAB_00164b23;
            }
            else if (((plVar9->field_0x9 & 1) != 0) &&
                    (((plVar9->schema->flags & 1) == 0 ||
                     (iVar4 = strcmp((char *)plVar9->ht,(char *)plVar14->ht), iVar4 != 0))))
            goto LAB_00164b23;
            if (plVar9 == plStack_40) {
              plStack_40 = plVar17;
            }
            lyd_free(plVar9);
          }
          goto LAB_00164b23;
        }
      }
    }
LAB_00164ca8:
    if (plStack_40 == (lyd_node *)0x0) {
      plStack_40 = plVar14;
      if (parent != (lyd_node *)0x0) {
        *pplVar1 = plVar14;
      }
    }
    else if (local_31 == '\0') {
      for (plVar6 = plVar14->schema->parent;
          (plVar6->nodetype & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN; plVar6 = lys_parent(plVar6)) {
      }
      plVar7 = (lys_node *)0x0;
      pplVar11 = &stack0xffffffffffffffc0;
      while (plVar17 = *pplVar11, plVar17 != (lyd_node *)0x0) {
        while( true ) {
          module = lys_node_module(plVar6);
          plVar7 = lys_getnext(plVar7,plVar6,module,0);
          if (plVar7 == (lys_node *)0x0) break;
          plVar10 = plVar14->schema;
          if ((plVar17->schema == plVar7) || (plVar10 == plVar7)) goto LAB_00164d50;
        }
        plVar10 = plVar14->schema;
LAB_00164d50:
        if (plVar10 == plVar7) {
          if (((plVar7->nodetype & (LYS_LIST|LYS_LEAFLIST)) == LYS_UNKNOWN) ||
             (plVar17->schema != plVar10)) goto LAB_00164da4;
          goto LAB_00164d6e;
        }
        pplVar11 = &plVar17->next;
      }
LAB_00164d7f:
      plVar17 = plStack_40->prev;
      plVar17->next = plVar14;
      plVar14->prev = plVar17;
      plStack_40->prev = plVar14;
    }
    else {
      plVar17 = plStack_40->prev;
      plVar17->next = plVar14;
      plVar14->prev = plVar17;
      plStack_40->prev = plVar14;
    }
  }
  else {
    plVar8 = lys_is_key(node_00,&local_41);
    if (plVar8 == (lys_node_list *)0x0) {
      node_00 = (lys_node_leaf *)plVar14->schema;
      goto LAB_00164ae3;
    }
    pplVar11 = pplVar1;
    for (uVar13 = 0; (plVar17 = *pplVar11, plVar17 != (lyd_node *)0x0 && (uVar13 < local_41));
        uVar13 = uVar13 + 1) {
      if (plVar17->schema->nodetype != LYS_LEAF) goto LAB_00164c5b;
      pplVar11 = &plVar17->next;
    }
    if (plVar17 == (lyd_node *)0x0) goto LAB_00164ca8;
LAB_00164c5b:
    plVar9 = *pplVar1;
    if (*pplVar1 == plVar17) {
      *pplVar1 = plVar14;
      plVar9 = plVar14;
    }
    plVar2 = plVar17->prev;
    if (plVar2->next != (lyd_node *)0x0) {
      plVar2->next = plVar14;
    }
    plVar14->prev = plVar2;
    plVar17->prev = plVar14;
    plVar14->next = plVar17;
    if (plVar9 != plStack_40) {
      plStack_40 = plVar9;
    }
  }
  goto LAB_00164e0c;
code_r0x00164ba4:
  pplVar11 = &plVar17->next;
  goto LAB_00164b93;
LAB_00164d6e:
  if (plVar17 == (lyd_node *)0x0) goto LAB_00164d7f;
  if (plVar17->schema != plVar10) goto LAB_00164da4;
  plVar17 = plVar17->next;
  goto LAB_00164d6e;
LAB_00164da4:
  if (plVar17 == plStack_40) {
    pplVar11 = pplVar1;
    plStack_40 = plVar14;
    if (parent == (lyd_node *)0x0) goto LAB_00164dc8;
  }
  else {
    pplVar11 = &plVar17->prev->next;
  }
  *pplVar11 = plVar14;
LAB_00164dc8:
  plVar14->prev = plVar17->prev;
  plVar17->prev = plVar14;
  plVar14->next = plVar17;
LAB_00164e0c:
  lyd_unlink_hash(plVar14,plVar14->parent);
  plVar14->parent = parent;
  lyd_insert_hash(plVar14);
  if (invalidate != 0) {
    check_leaf_list_backlinks(plVar14,0);
  }
  if (local_54 != 0) {
    lyd_insert_setinvalid(plVar14);
  }
  goto LAB_00164a3f;
}

Assistant:

int
lyd_insert_common(struct lyd_node *parent, struct lyd_node **sibling, struct lyd_node *node, int invalidate)
{
    struct lys_node *par1, *par2;
    const struct lys_node *siter;
    struct lyd_node *start, *iter, *ins, *next1, *next2;
    int invalid = 0, isrpc = 0, clrdflt = 0;
    struct ly_set *llists = NULL;
    int i;
    uint8_t pos;
    int stype = LYS_INPUT | LYS_OUTPUT;

    assert(parent || sibling);

    /* get first sibling */
    if (parent) {
        start = parent->child;
    } else {
        for (start = *sibling; start->prev->next; start = start->prev);
    }

    /* check placing the node to the appropriate place according to the schema */
    if (!start) {
        if (!parent) {
            /* empty tree to insert */
            if (node->parent || node->prev->next) {
                /* unlink the node first */
                lyd_unlink_internal(node, 1);
            } /* else insert also node's siblings */
            *sibling = node;
            return EXIT_SUCCESS;
        }
        par1 = parent->schema;
        if (par1->nodetype & (LYS_RPC | LYS_ACTION)) {
            /* it is not clear if the tree being created is going to
             * be rpc (LYS_INPUT) or rpc-reply (LYS_OUTPUT) so we have to
             * compare against LYS_RPC or LYS_ACTION in par2
             */
            stype = LYS_RPC | LYS_ACTION;
        }
    } else if (parent && (parent->schema->nodetype & (LYS_RPC | LYS_ACTION))) {
        par1 = parent->schema;
        stype = LYS_RPC | LYS_ACTION;
    } else {
        for (par1 = lys_parent(start->schema);
             par1 && !(par1->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF));
             par1 = lys_parent(par1));
    }
    for (par2 = lys_parent(node->schema);
         par2 && !(par2->nodetype & (LYS_CONTAINER | LYS_LIST | stype | LYS_NOTIF));
         par2 = lys_parent(par2));
    if (par1 != par2) {
        LOGERR(parent->schema->module->ctx, LY_EINVAL, "Cannot insert, different parents (\"%s\" and \"%s\").",
               (par1 ? par1->name : "<top-lvl>"), (par2 ? par2->name : "<top-lvl>"));
        return EXIT_FAILURE;
    }

    if (invalidate) {
        invalid = isrpc = lyp_is_rpc_action(node->schema);
        if (!parent || node->parent != parent || isrpc) {
            /* it is not just moving under a parent node or it is in an RPC where
             * nodes order matters, so the validation will be necessary */
            invalid++;
        }
    }

    /* unlink only if it is not a list of siblings without a parent and node is not the first sibling */
    if (node->parent || node->prev->next) {
        /* do it permanent if the parents are not exact same or if it is top-level */
        lyd_unlink_internal(node, invalid);
    }

    llists = ly_set_new();

    /* process the nodes to insert one by one */
    LY_TREE_FOR_SAFE(node, next1, ins) {
        if (invalid == 1) {
            /* auto delete nodes from other cases, if any;
             * this is done only if node->parent != parent */
            if (lyv_multicases(ins, NULL, &start, 1, NULL)) {
                goto error;
            }
        }

        /* isolate the node to be handled separately */
        ins->prev = ins;
        ins->next = NULL;

        iter = NULL;
        if (!ins->dflt) {
            clrdflt = 1;
        }

        /* are we inserting list key? */
        if (!ins->dflt && ins->schema->nodetype == LYS_LEAF && lys_is_key((struct lys_node_leaf *)ins->schema, &pos)) {
            /* yes, we have a key, get know its position */
            for (i = 0, iter = parent->child;
                    iter && i < pos && iter->schema->nodetype == LYS_LEAF;
                    i++, iter = iter->next);
            if (iter) {
                /* insert list's key to the correct position - before the iter */
                if (parent->child == iter) {
                    parent->child = ins;
                }
                if (iter->prev->next) {
                    iter->prev->next = ins;
                }
                ins->prev = iter->prev;
                iter->prev = ins;
                ins->next = iter;

                /* update start element */
                if (parent->child != start) {
                    start = parent->child;
                }
            }

            /* try to find previously present default instance to replace */
        } else if (ins->schema->nodetype == LYS_LEAFLIST) {
            i = (int)llists->number;
            if ((ly_set_add(llists, ins->schema, 0) != i) || ins->dflt) {
                /* each leaf-list must be cleared only once (except when looking for exact same existing dflt nodes) */
                LY_TREE_FOR_SAFE(start, next2, iter) {
                    if (iter->schema == ins->schema) {
                        if ((ins->dflt && (!iter->dflt || ((iter->schema->flags & LYS_CONFIG_W) &&
                                                           !strcmp(((struct lyd_node_leaf_list *)iter)->value_str,
                                                                  ((struct lyd_node_leaf_list *)ins)->value_str))))
                                || (!ins->dflt && iter->dflt)) {
                            if (iter == start) {
                                start = next2;
                            }
                            lyd_free(iter);
                        }
                    }
                }
            }
        } else if (ins->schema->nodetype == LYS_LEAF || (ins->schema->nodetype == LYS_CONTAINER
                        && !((struct lys_node_container *)ins->schema)->presence)) {
            LY_TREE_FOR(start, iter) {
                if (iter->schema == ins->schema) {
                    if (ins->dflt || iter->dflt) {
                        /* replace existing (either explicit or default) node with the new (either explicit or default) node */
                        lyd_replace(iter, ins, 1);
                    } else {
                        /* keep both explicit nodes, let the caller solve it later */
                        iter = NULL;
                    }
                    break;
                }
            }
        }

        if (!iter) {
            if (!start) {
                /* add as the only child of the parent */
                start = ins;
                if (parent) {
                    parent->child = ins;
                }
            } else if (isrpc) {
                /* add to the specific position in rpc/rpc-reply/action */
                for (par1 = ins->schema->parent; !(par1->nodetype & (LYS_INPUT | LYS_OUTPUT)); par1 = lys_parent(par1));
                siter = NULL;
                LY_TREE_FOR(start, iter) {
                    while ((siter = lys_getnext(siter, par1, lys_node_module(par1), 0))) {
                        if (iter->schema == siter || ins->schema == siter) {
                            break;
                        }
                    }
                    if (ins->schema == siter) {
                        if ((siter->nodetype & (LYS_LEAFLIST | LYS_LIST)) && iter->schema == siter) {
                            /* we are inserting leaflist/list instance, but since there are already
                             * some instances of the same leaflist/list, we want to insert the new one
                             * as the last instance, so here we have to move on */
                            while (iter && iter->schema == siter) {
                                iter = iter->next;
                            }
                            if (!iter) {
                                break;
                            }
                        }
                        /* we have the correct place for new node (before the iter) */
                        if (iter == start) {
                            start = ins;
                            if (parent) {
                                parent->child = ins;
                            }
                        } else {
                            iter->prev->next = ins;
                        }
                        ins->prev = iter->prev;
                        iter->prev = ins;
                        ins->next = iter;

                        /* we are done */
                        break;
                    }
                }
                if (!iter) {
                    /* add as the last child of the parent */
                    start->prev->next = ins;
                    ins->prev = start->prev;
                    start->prev = ins;
                }
            } else {
                /* add as the last child of the parent */
                start->prev->next = ins;
                ins->prev = start->prev;
                start->prev = ins;
            }
        }

#ifdef LY_ENABLED_CACHE
        lyd_unlink_hash(ins, ins->parent);
#endif

        ins->parent = parent;

#ifdef LY_ENABLED_CACHE
        lyd_insert_hash(ins);
#endif

        if (invalidate) {
            check_leaf_list_backlinks(ins, 0);
        }

        if (invalid) {
            lyd_insert_setinvalid(ins);
        }
    }
    ly_set_free(llists);

    if (clrdflt) {
        /* remove the dflt flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    if (sibling) {
        *sibling = start;
    }
    return EXIT_SUCCESS;

error:
    ly_set_free(llists);
    return EXIT_FAILURE;
}